

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_poller_rem(green_poller_t poller,green_future_t future)

{
  int lhs;
  size_t sVar1;
  green_future_t future_local;
  green_poller_t poller_local;
  
  fprintf(_stderr,"green_poller_rem()\n");
  if ((poller == (green_poller_t)0x0) || (future == (green_future_t)0x0)) {
    poller_local._4_4_ = 1;
  }
  else if (future->poller == poller) {
    if (poller->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x1fe);
      fflush(_stderr);
      abort();
    }
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x1ff);
      fflush(_stderr);
      abort();
    }
    if (poller->loop != future->loop) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->loop == future->loop",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x200);
      fflush(_stderr);
      abort();
    }
    if (future->poller != poller) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->poller == poller",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x201);
      fflush(_stderr);
      abort();
    }
    if (future->slot < 0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->slot >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x202);
      fflush(_stderr);
      abort();
    }
    if ((ulong)(long)future->slot < poller->busy) {
      if (future->state != green_future_pending) {
        fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",
                "future->state == green_future_pending",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                ,0x209);
        fflush(_stderr);
        abort();
      }
      lhs = future->slot;
      sVar1 = poller->busy - 1;
      poller->busy = sVar1;
      green_poller_swap(poller,lhs,(int)sVar1);
      green_poller_swap(poller,(int)poller->busy,(int)poller->used + -1);
    }
    else {
      if (future->state == green_future_pending) {
        fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",
                "future->state != green_future_pending",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                ,0x205);
        fflush(_stderr);
        abort();
      }
      green_poller_swap(poller,future->slot,(int)poller->used + -1);
    }
    future->slot = -1;
    future->poller = (green_poller_t)0x0;
    sVar1 = poller->used;
    poller->used = sVar1 - 1;
    poller->futures[sVar1 - 1] = (green_future_t)0x0;
    green_future_release(future);
    poller_local._4_4_ = 0;
  }
  else {
    poller_local._4_4_ = 6;
  }
  return poller_local._4_4_;
}

Assistant:

int green_poller_rem(green_poller_t poller, green_future_t future)
{
    fprintf(stderr, "green_poller_rem()\n");
    if ((poller == NULL) || (future == NULL)) {
        return GREEN_EINVAL;
    }
    if (future->poller != poller) {
        return GREEN_ENOENT;
    }

    green_assert(poller->refs > 0);
    green_assert(future->refs > 0);
    green_assert(poller->loop == future->loop);
    green_assert(future->poller == poller);
    green_assert(future->slot >= 0);

    if (future->slot >= poller->busy) {
        green_assert(future->state != green_future_pending);
        green_poller_swap(poller, future->slot, poller->used-1);
    }
    else {
        green_assert(future->state == green_future_pending);
        green_poller_swap(poller, future->slot, --poller->busy);
        green_poller_swap(poller, poller->busy, poller->used-1);
    }
    future->slot = -1;
    future->poller = NULL;
    poller->futures[--poller->used] = NULL;
    green_future_release(future);
    return GREEN_SUCCESS;
}